

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_combine(wally_psbt *psbt,wally_psbt *src)

{
  _Bool _Var1;
  int iVar2;
  size_t txid_len;
  uchar txid [32];
  
  iVar2 = -2;
  if ((((psbt != (wally_psbt *)0x0) && (src != (wally_psbt *)0x0)) && (psbt->tx != (wally_tx *)0x0))
     && (src->tx != (wally_tx *)0x0)) {
    iVar2 = wally_tx_get_txid(src->tx,txid,0x20);
    if (iVar2 == 0) {
      _Var1 = is_matching_txid(psbt->tx,txid,txid_len);
      iVar2 = (uint)_Var1 * 2 + -2;
    }
    wally_clear(txid,0x20);
    if (iVar2 == 0) {
      iVar2 = psbt_combine(psbt,src);
    }
  }
  return iVar2;
}

Assistant:

int wally_psbt_combine(struct wally_psbt *psbt, const struct wally_psbt *src)
{
    unsigned char txid[WALLY_TXHASH_LEN];
    int ret;

    if (!psbt || !psbt->tx || !src || !src->tx)
        return WALLY_EINVAL;

    ret = wally_tx_get_txid(src->tx, txid, sizeof(txid));

    if (ret == WALLY_OK && !is_matching_txid(psbt->tx, txid, sizeof(txid)))
        ret = WALLY_EINVAL; /* Transactions don't match */

    wally_clear(txid, sizeof(txid));
    return ret == WALLY_OK ? psbt_combine(psbt, src) : ret;
}